

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_52dd::TlbExportVisitor::visit_(TlbExportVisitor *this,Numeric *type)

{
  int iVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  Type *type_00;
  string sStack_68;
  string local_48;
  
  poVar2 = std::operator<<(this->m_stream,"<numeric name=\"");
  Typelib::Type::getName_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,(string *)&sStack_68);
  poVar2 = std::operator<<(poVar2,"\" ");
  poVar2 = std::operator<<(poVar2,"category=\"");
  iVar1 = Typelib::Numeric::getNumericCategory();
  if (iVar1 - 8U < 3) {
    poVar2 = std::operator<<(poVar2,&DAT_0010f21c +
                                    *(int *)(&DAT_0010f21c + (ulong)(iVar1 - 8U) * 4));
    poVar2 = std::operator<<(poVar2,"\" ");
    poVar2 = std::operator<<(poVar2,"size=\"");
    Typelib::Type::getSize();
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"\" ");
    (anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_(&local_48,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_48);
    std::operator<<(poVar2,">\n");
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&sStack_68);
    poVar2 = std::operator<<(this->m_stream,(string *)&this->m_indent);
    (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_(&sStack_68,type,type_00);
    poVar2 = std::operator<<(poVar2,(string *)&sStack_68);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&sStack_68);
    poVar2 = std::operator<<(this->m_stream,(string *)&this->m_indent);
    std::operator<<(poVar2,"</numeric>");
    return true;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "invalid category";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

bool TlbExportVisitor::visit_(Numeric const& type)
    {
        m_stream
            << "<numeric name=\"" << type.getName() << "\" "
            << "category=\"" << getStringCategory(type.getNumericCategory()) << "\" "
            << "size=\"" << type.getSize() << "\" " << emitSourceID() << ">\n";
        m_stream << m_indent << emitMetaData(type) << "\n";
        m_stream << m_indent << "</numeric>";

        return true;
    }